

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::walk
          (Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *this,
          Expression **root)

{
  size_t sVar1;
  Task TVar2;
  TaskFunc local_28;
  Task task;
  Expression **root_local;
  Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_> *this_local;
  
  sVar1 = SmallVector<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_10UL>
          ::size(&this->stack);
  if (sVar1 != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<wasm::LocalScanner, wasm::Visitor<wasm::LocalScanner>>::walk(Expression *&) [SubType = wasm::LocalScanner, VisitorType = wasm::Visitor<wasm::LocalScanner>]"
                 );
  }
  pushTask(this,PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::scan,root)
  ;
  while( true ) {
    sVar1 = SmallVector<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_10UL>
            ::size(&this->stack);
    if (sVar1 == 0) {
      return;
    }
    TVar2 = popTask(this);
    task.func = (TaskFunc)TVar2.currp;
    this->replacep = (Expression **)task.func;
    if (*(long *)task.func == 0) break;
    local_28 = TVar2.func;
    (*local_28)((LocalScanner *)this,(Expression **)task.func);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<wasm::LocalScanner, wasm::Visitor<wasm::LocalScanner>>::walk(Expression *&) [SubType = wasm::LocalScanner, VisitorType = wasm::Visitor<wasm::LocalScanner>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }